

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O3

void see_lamp_flicker(obj *obj,char *tailer)

{
  char *pcVar1;
  char *line;
  
  if ((byte)obj->where - 3 < 2) {
    pcVar1 = Yname2(obj);
    line = "%s flickers%s.";
  }
  else {
    if (obj->where != 1) {
      return;
    }
    pcVar1 = xname(obj);
    pcVar1 = an(pcVar1);
    line = "You see %s flicker%s.";
  }
  pline(line,pcVar1,tailer);
  obj->field_0x4a = obj->field_0x4a | 0x10;
  return;
}

Assistant:

static void see_lamp_flicker(struct obj *obj, const char *tailer)
{
	switch (obj->where) {
	    case OBJ_INVENT:
	    case OBJ_MINVENT:
		pline("%s flickers%s.", Yname2(obj), tailer);
		break;
	    case OBJ_FLOOR:
		pline("You see %s flicker%s.", an(xname(obj)), tailer);
		break;
	    default:
		return;
	}
	obj->known = 1;	/* ID charge count */
}